

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

Expr * sqlite3WindowOffsetExpr(Parse *pParse,Expr *pExpr)

{
  Expr *pEVar1;
  Walker w;
  Walker local_48;
  
  local_48.eCode = 1;
  local_48.pParse = (Parse *)0x0;
  local_48.xExprCallback = exprNodeIsConstant;
  local_48.xSelectCallback = sqlite3SelectWalkFail;
  if (pExpr != (Expr *)0x0) {
    sqlite3WalkExprNN(&local_48,pExpr);
    if (local_48.eCode != 0) {
      return pExpr;
    }
    if (1 < pParse->eParseMode) {
      sqlite3RenameExprUnmap(pParse,pExpr);
    }
    sqlite3ExprDeleteNN(pParse->db,pExpr);
    pEVar1 = (Expr *)sqlite3DbMallocRawNN(pParse->db,0x48);
    if (pEVar1 != (Expr *)0x0) {
      pEVar1->op = '\0';
      pEVar1->affExpr = '\0';
      pEVar1->op2 = '\0';
      pEVar1->field_0x3 = 0;
      pEVar1->flags = 0;
      (pEVar1->u).zToken = (char *)0x0;
      pEVar1->iColumn = 0;
      pEVar1->iAgg = 0;
      pEVar1->w = (anon_union_4_2_009eaf8f_for_w)0x0;
      pEVar1->pAggInfo = (AggInfo *)0x0;
      (pEVar1->x).pList = (ExprList *)0x0;
      pEVar1->nHeight = 0;
      pEVar1->iTable = 0;
      pEVar1->pLeft = (Expr *)0x0;
      pEVar1->pRight = (Expr *)0x0;
      (pEVar1->y).pTab = (Table *)0x0;
      pEVar1->op = 'y';
      pEVar1->iAgg = -1;
      pEVar1->nHeight = 1;
      return pEVar1;
    }
  }
  return (Expr *)0x0;
}

Assistant:

static Expr *sqlite3WindowOffsetExpr(Parse *pParse, Expr *pExpr){
  if( 0==sqlite3ExprIsConstant(0,pExpr) ){
    if( IN_RENAME_OBJECT ) sqlite3RenameExprUnmap(pParse, pExpr);
    sqlite3ExprDelete(pParse->db, pExpr);
    pExpr = sqlite3ExprAlloc(pParse->db, TK_NULL, 0, 0);
  }
  return pExpr;
}